

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QSslCertificate>::reallocateAndGrow
          (QArrayDataPointer<QSslCertificate> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QSslCertificate> *old)

{
  QArrayData *pQVar1;
  QSslCertificatePrivate *pQVar2;
  Data *pDVar3;
  QSslCertificate *pQVar4;
  qsizetype qVar5;
  long lVar6;
  QSslCertificate *pQVar7;
  QSslCertificate *pQVar8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  QArrayDataPointer<QSslCertificate> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<QSslCertificate> *)0x0 && where == GrowsAtEnd) &&
       (pQVar1 = &this->d->super_QArrayData, pQVar1 != (QArrayData *)0x0)) && (0 < n)) &&
     ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i < 2)) {
    auVar9 = QArrayData::reallocateUnaligned
                       (pQVar1,this->ptr,8,
                        n + this->size +
                        ((long)((long)this->ptr -
                               ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 3),
                        Grow);
    this->d = (Data *)auVar9._0_8_;
    this->ptr = (QSslCertificate *)auVar9._8_8_;
  }
  else {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (QSslCertificate *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_48,this,n,where);
    pQVar4 = local_48.ptr;
    if (this->size != 0) {
      lVar6 = this->size + (n >> 0x3f & n);
      if (((this->d == (Data *)0x0) || (old != (QArrayDataPointer<QSslCertificate> *)0x0)) ||
         (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        if ((lVar6 != 0) && (0 < lVar6)) {
          pQVar8 = this->ptr;
          pQVar7 = pQVar8 + lVar6;
          do {
            QSslCertificate::QSslCertificate(pQVar4 + local_48.size,pQVar8);
            pQVar8 = pQVar8 + 1;
            local_48.size = local_48.size + 1;
          } while (pQVar8 < pQVar7);
        }
      }
      else if ((lVar6 != 0) && (0 < lVar6)) {
        pQVar7 = this->ptr;
        pQVar4 = pQVar7 + lVar6;
        do {
          pQVar2 = (pQVar7->d).d.ptr;
          (pQVar7->d).d.ptr = (QSslCertificatePrivate *)0x0;
          local_48.ptr[local_48.size].d.d.ptr = pQVar2;
          pQVar7 = pQVar7 + 1;
          local_48.size = local_48.size + 1;
        } while (pQVar7 < pQVar4);
      }
    }
    pDVar3 = this->d;
    pQVar4 = this->ptr;
    this->d = local_48.d;
    this->ptr = local_48.ptr;
    qVar5 = this->size;
    this->size = local_48.size;
    local_48.d = pDVar3;
    local_48.ptr = pQVar4;
    local_48.size = qVar5;
    if (old != (QArrayDataPointer<QSslCertificate> *)0x0) {
      local_48.d = old->d;
      local_48.ptr = old->ptr;
      old->d = pDVar3;
      old->ptr = pQVar4;
      local_48.size = old->size;
      old->size = qVar5;
    }
    ~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }